

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_hash_table.hpp
# Opt level: O3

void __thiscall
poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::compact_hash_table
          (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this,
          uint32_t univ_bits,uint32_t capa_bits)

{
  pointer puVar1;
  pointer puVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint64_t uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 in_XMM1 [16];
  undefined1 local_48 [16];
  pointer local_38;
  uint64_t local_30;
  uint64_t uStack_28;
  uint64_t local_20;
  
  (this->table_).size_ = 0;
  (this->table_).mask_ = 0;
  (this->table_).width_ = 0;
  this->size_ = 0;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->table_).size_ = 0;
  (this->univ_size_).bits_ = univ_bits;
  uVar4 = -1L << ((ulong)univ_bits & 0x3f) ^ 0xffffffffffffffff;
  (this->univ_size_).mask_ = uVar4;
  uVar6 = 0xc;
  if (0xc < capa_bits) {
    uVar6 = (ulong)capa_bits;
  }
  uVar8 = -1L << (uVar6 & 0x3f);
  (this->capa_size_).bits_ = (uint32_t)uVar6;
  (this->capa_size_).mask_ = ~uVar8;
  uVar5 = univ_bits - (uint32_t)uVar6;
  (this->quo_size_).bits_ = uVar5;
  uVar6 = ~(-1L << ((ulong)uVar5 & 0x3f));
  (this->quo_size_).mask_ = uVar6;
  this->quo_shift_ = 9;
  this->quo_invmask_ = ~(uVar6 << 9);
  auVar3 = vcvtusi2sd_avx512f(in_XMM1,uVar8 * -0x50);
  auVar9._0_8_ = auVar3._0_8_ / 100.0;
  auVar9._8_8_ = auVar3._8_8_;
  uVar7 = vcvttsd2usi_avx512f(auVar9);
  this->max_size_ = uVar7;
  (this->hasher_).shift_ = (univ_bits >> 1) + 1;
  (this->hasher_).univ_size_.bits_ = univ_bits;
  (this->hasher_).univ_size_.mask_ = uVar4;
  compact_vector::compact_vector((compact_vector *)local_48,-uVar8,uVar5 + 9,0x1fd);
  puVar1 = (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_48._0_8_;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_48._8_8_;
  local_48 = ZEXT816(0) << 0x20;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_38;
  local_38 = (pointer)0x0;
  if (puVar1 == (pointer)0x0) {
    (this->table_).width_ = local_20;
    (this->table_).size_ = local_30;
    (this->table_).mask_ = uStack_28;
  }
  else {
    operator_delete(puVar1,(long)puVar2 - (long)puVar1);
    (this->table_).width_ = local_20;
    (this->table_).size_ = local_30;
    (this->table_).mask_ = uStack_28;
    if ((pointer)local_48._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_48._0_8_,(long)local_38 - local_48._0_8_);
    }
  }
  return;
}

Assistant:

explicit compact_hash_table(uint32_t univ_bits, uint32_t capa_bits = min_capa_bits) {
        univ_size_ = size_p2{univ_bits};
        capa_size_ = size_p2{std::max(min_capa_bits, capa_bits)};

        assert(capa_size_.bits() <= univ_size_.bits());

        quo_size_ = size_p2{univ_size_.bits() - capa_size_.bits()};
        quo_shift_ = 2 + val_bits;
        quo_invmask_ = ~(quo_size_.mask() << quo_shift_);

        max_size_ = static_cast<uint64_t>(capa_size_.size() * MaxFactor / 100.0);

        hasher_ = Hasher{univ_size_.bits()};
        table_ = compact_vector{capa_size_.size(), quo_size_.bits() + val_bits + 2, (val_mask << 2) | 1ULL};
    }